

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O1

double __thiscall chrono::ChDirectSolverLS::Solve(ChDirectSolverLS *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<double> *v;
  ChVectorDynamic<double> *this_00;
  undefined1 auVar1 [16];
  uint uVar2;
  rep_conflict rVar3;
  long lVar4;
  long *plVar5;
  ChLog *pCVar6;
  ChStreamOutAscii *pCVar7;
  long *plVar8;
  ChDirectSolverLS *pCVar9;
  undefined1 auVar10 [64];
  string local_78;
  _func_int **local_58;
  _Alloc_hider local_48;
  undefined8 local_38;
  undefined1 extraout_var [56];
  
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_start.__d.__r = rVar3;
  v = &this->m_rhs;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,0,v);
  this_00 = &this->m_sol;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_end.__d.__r = lVar4;
  (this->m_timer_solve_assembly).m_total.__r =
       (double)(lVar4 - (this->m_timer_solve_assembly).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_solve_assembly).m_total.__r;
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    pCVar9 = (ChDirectSolverLS *)&stack0xffffffffffffffa8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar9,"LS_"
                   ,&(this->super_ChSolverLS).super_ChSolver.frame_id);
    plVar5 = (long *)std::__cxx11::string::append((char *)pCVar9);
    plVar8 = plVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar8) {
      local_78.field_2._M_allocated_capacity = *plVar8;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *plVar8;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    WriteVector(pCVar9,&local_78,v);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((_Alloc_hider *)local_58 != &stack0xffffffffffffffb8) {
      operator_delete(local_58,(ulong)(local_48._M_p + 1));
    }
  }
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_solvercall).m_start.__d.__r = rVar3;
  uVar2 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xd])(this);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_solvercall).m_end.__d.__r = lVar4;
  (this->m_timer_solve_solvercall).m_total.__r =
       (double)(lVar4 - (this->m_timer_solve_solvercall).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_solve_solvercall).m_total.__r;
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    pCVar9 = (ChDirectSolverLS *)&stack0xffffffffffffffa8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar9,"LS_"
                   ,&(this->super_ChSolverLS).super_ChSolver.frame_id);
    plVar5 = (long *)std::__cxx11::string::append((char *)pCVar9);
    plVar8 = plVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar8) {
      local_78.field_2._M_allocated_capacity = *plVar8;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *plVar8;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    WriteVector(pCVar9,&local_78,this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((_Alloc_hider *)local_58 != &stack0xffffffffffffffb8) {
      operator_delete(local_58,(ulong)(local_48._M_p + 1));
    }
  }
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_start.__d.__r = rVar3;
  (*sysd->_vptr_ChSystemDescriptor[0x15])(sysd,this_00);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_end.__d.__r = lVar4;
  (this->m_timer_solve_assembly).m_total.__r =
       (double)(lVar4 - (this->m_timer_solve_assembly).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_solve_assembly).m_total.__r;
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    if ((this->m_mat).m_innerSize !=
        (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    local_78._M_string_length = (size_type)&this->m_mat;
    local_78._M_dataplus._M_p = (pointer)v;
    local_78.field_2._M_allocated_capacity = (size_type)this_00;
    if ((this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != (this->m_mat).m_outerSize) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    auVar10._0_8_ =
         Eigen::
         MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>
         ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                        *)&local_78);
    auVar10._8_56_ = extraout_var;
    auVar1 = vsqrtsd_avx(auVar10._0_16_,auVar10._0_16_);
    local_38 = auVar1._0_8_;
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii," Solver solve [");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_solve_call);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"]  |residual| = ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,(double)local_38);
    ChStreamOutAscii::operator<<(pCVar7,"\n\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  assembly rhs+sol:  ");
    lVar4 = std::chrono::_V2::system_clock::now();
    pCVar7 = ChStreamOutAscii::operator<<
                       (pCVar7,(double)(lVar4 - (this->m_timer_solve_assembly).m_start.__d.__r) /
                               1000000000.0);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"s\n");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"  solve:             ");
    lVar4 = std::chrono::_V2::system_clock::now();
    pCVar7 = ChStreamOutAscii::operator<<
                       (pCVar7,(double)(lVar4 - (this->m_timer_solve_solvercall).m_start.__d.__r) /
                               1000000000.0);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
  }
  if ((char)uVar2 == '\0') {
    pCVar6 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"Solver solve failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return (double)(uVar2 & 0xff);
}

Assistant:

double ChDirectSolverLS::Solve(ChSystemDescriptor& sysd) {
    // Assemble the problem right-hand side vector
    m_timer_solve_assembly.start();
    sysd.ConvertToMatrixForm(nullptr, &m_rhs);
    m_sol.resize(m_rhs.size());
    m_timer_solve_assembly.stop();

    if (write_matrix)
        WriteVector("LS_" + frame_id + "_b.dat", m_rhs);

    // Let the concrete solver compute the solution
    m_timer_solve_solvercall.start();
    bool result = SolveSystem();
    m_timer_solve_solvercall.stop();

    if (write_matrix)
        WriteVector("LS_" + frame_id + "_x.dat", m_sol);

    // Scatter solution vector to the system descriptor
    m_timer_solve_assembly.start();
    sysd.FromVectorToUnknowns(m_sol);
    m_timer_solve_assembly.stop();

    if (verbose) {
        double res_norm = (m_rhs - m_mat * m_sol).norm();
        GetLog() << " Solver solve [" << m_solve_call << "]  |residual| = " << res_norm << "\n\n";
        GetLog() << "  assembly rhs+sol:  " << m_timer_solve_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  solve:             " << m_timer_solve_solvercall.GetTimeSecondsIntermediate() << "\n";
    }

    if (!result) {
        // If the solution failed, let the concrete solver display an error message.
        GetLog() << "Solver solve failed\n";
        PrintErrorMessage();
    }

    return result;
}